

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O0

PyObject * libxml_last(PyObject *self,PyObject *args)

{
  int iVar1;
  PyObject *pPVar2;
  xmlChar *local_50;
  xmlAttrPtr attr;
  xmlNodePtr res;
  xmlNodePtr cur;
  PyObject *obj;
  PyObject *resultobj;
  PyObject *args_local;
  PyObject *self_local;
  
  resultobj = args;
  args_local = self;
  iVar1 = _PyArg_ParseTuple_SizeT(args,"O:last",&cur);
  if (iVar1 == 0) {
    return (PyObject *)0x0;
  }
  if (cur == (xmlNodePtr)&_Py_NoneStruct) {
    local_50 = (xmlChar *)0x0;
  }
  else {
    local_50 = cur->name;
  }
  iVar1 = *(int *)(local_50 + 8);
  if (iVar1 != 1) {
    if (iVar1 == 2) {
      attr = *(xmlAttrPtr *)(local_50 + 0x20);
      goto LAB_0014aa82;
    }
    if ((4 < iVar1 - 5U) && (iVar1 != 0xd && iVar1 != 0xe)) {
      attr = (xmlAttrPtr)0x0;
      goto LAB_0014aa82;
    }
  }
  attr = *(xmlAttrPtr *)(local_50 + 0x20);
LAB_0014aa82:
  pPVar2 = libxml_xmlNodePtrWrap((xmlNodePtr)attr);
  return pPVar2;
}

Assistant:

static PyObject *
libxml_last(ATTRIBUTE_UNUSED PyObject * self, PyObject * args)
{
    PyObject *resultobj, *obj;
    xmlNodePtr cur;
    xmlNodePtr res;

    if (!PyArg_ParseTuple(args, (char *) "O:last", &obj))
        return NULL;
    cur = PyxmlNode_Get(obj);

    switch (cur->type) {
        case XML_ELEMENT_NODE:
        case XML_ENTITY_REF_NODE:
        case XML_ENTITY_NODE:
        case XML_PI_NODE:
        case XML_COMMENT_NODE:
        case XML_DOCUMENT_NODE:
        case XML_HTML_DOCUMENT_NODE:
        case XML_DTD_NODE:
            res = cur->last;
            break;
        case XML_ATTRIBUTE_NODE:{
                xmlAttrPtr attr = (xmlAttrPtr) cur;

                res = attr->last;
		break;
            }
        default:
            res = NULL;
            break;
    }
    resultobj = libxml_xmlNodePtrWrap(res);
    return resultobj;
}